

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int var_mult_const(gen_ctx_t gen_ctx,ssa_edge_t_conflict se,bb_t_conflict from_bb,
                  MIR_op_t **var_op_ref,int64_t *c)

{
  MIR_op_t *pMVar1;
  bb_insn_t_conflict bb_insn;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  MIR_insn_t pMVar7;
  
  iVar4 = 0;
  if (se == (ssa_edge_t_conflict)0x0) {
    return 0;
  }
  pMVar1 = *var_op_ref;
  if ((pMVar1 == (MIR_op_t *)0x0) || (pMVar1->field_0x8 != '\x02')) {
    __assert_fail("*var_op_ref != ((void*)0) && (*var_op_ref)->mode == MIR_OP_VAR",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x15e4,"int var_mult_const(gen_ctx_t, ssa_edge_t, bb_t, MIR_op_t **, int64_t *)")
    ;
  }
  pcVar5 = MIR_reg_hard_reg_name
                     (gen_ctx->ctx,(pMVar1->u).reg - 0x21,(gen_ctx->curr_func_item->u).func);
  if (pcVar5 != (char *)0x0) {
    return 0;
  }
  pMVar7 = se->def->insn;
  *c = 0;
  iVar3 = (int)*(undefined8 *)&pMVar7->field_0x18;
  if (((iVar3 == 0x42) || (iVar3 == 0x2c)) && (*(char *)&pMVar7[1].insn_link.prev == '\x02')) {
    iVar2 = get_int_const(gen_ctx,(MIR_op_t *)&pMVar7[1].ops[0].u.str,c);
    iVar3 = *(int *)&pMVar7->field_0x18;
    if (iVar2 != 0) {
      uVar6 = *c;
      pMVar7 = pMVar7 + 1;
      if (iVar3 == 0x42) {
        if (0x3f < uVar6) {
          return 0;
        }
        uVar6 = 1L << (uVar6 & 0x3f);
        *c = uVar6;
      }
      goto LAB_00169877;
    }
  }
  if (iVar3 != 0x2c) {
    return 0;
  }
  if (*(char *)((long)&pMVar7[1].ops[0].u + 8) != '\x02') {
    return 0;
  }
  iVar3 = get_int_const(gen_ctx,(MIR_op_t *)(pMVar7 + 1),c);
  if (iVar3 == 0) {
    return 0;
  }
  uVar6 = *c;
  pMVar7 = (MIR_insn_t)&pMVar7[1].ops[0].u;
LAB_00169877:
  if (uVar6 < 0x100) {
    if (((pMVar7->data != (void *)0x0) &&
        (bb_insn = *(bb_insn_t_conflict *)((long)pMVar7->data + 8), bb_insn->bb != from_bb)) &&
       (iVar4 = cycle_phi_p(bb_insn), iVar4 != 0)) {
      return 0;
    }
    iVar4 = 1;
    *var_op_ref = (MIR_op_t *)pMVar7;
  }
  return iVar4;
}

Assistant:

static int var_mult_const (gen_ctx_t gen_ctx, ssa_edge_t se, bb_t from_bb, MIR_op_t **var_op_ref,
                           int64_t *c) {
  if (se == NULL) return FALSE; /* e.g. for arg */
  gen_assert (*var_op_ref != NULL && (*var_op_ref)->mode == MIR_OP_VAR);
  MIR_reg_t reg = (*var_op_ref)->u.var - MAX_HARD_REG;
  if (MIR_reg_hard_reg_name (gen_ctx->ctx, reg, curr_func_item->u.func) != NULL) return FALSE;
  MIR_insn_t insn = se->def->insn;
  MIR_op_t *res_ref = NULL;
  *c = 0;
  if ((insn->code == MIR_MUL || insn->code == MIR_LSH) && insn->ops[1].mode == MIR_OP_VAR
      && get_int_const (gen_ctx, &insn->ops[2], c)) {
    res_ref = &insn->ops[1];
    if (insn->code == MIR_LSH) {
      if (*c < 0 || *c >= (int) sizeof (int64_t) * 8)
        res_ref = NULL;
      else
        *c = (int64_t) 1 << *c;
    }
  } else if (insn->code == MIR_MUL && insn->ops[2].mode == MIR_OP_VAR
             && get_int_const (gen_ctx, &insn->ops[1], c)) {
    res_ref = &insn->ops[2];
  }
  if (res_ref == NULL) return FALSE;
  if (*c < 0 || *c > MIR_MAX_SCALE) return FALSE;
  if ((se = res_ref->data) != NULL && se->def->bb != from_bb && cycle_phi_p (se->def)) return FALSE;
  *var_op_ref = res_ref;
  return TRUE;
}